

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlimits.c
# Opt level: O0

int saxTest(char *filename,size_t limit,int options,int fail)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  long lVar3;
  bool bVar4;
  xmlSAXHandlerPtr old_sax;
  xmlDocPtr doc;
  xmlParserCtxtPtr ctxt;
  int res;
  int fail_local;
  int options_local;
  size_t limit_local;
  char *filename_local;
  
  nb_tests = nb_tests + 1;
  maxlen = limit;
  puVar2 = (undefined8 *)xmlNewParserCtxt();
  if (puVar2 == (undefined8 *)0x0) {
    fprintf(_stderr,"Failed to create parser context\n");
    filename_local._4_4_ = 1;
  }
  else {
    uVar1 = *puVar2;
    *puVar2 = callbackSAX2Handler;
    puVar2[1] = 0;
    lVar3 = xmlCtxtReadFile(puVar2,filename,0,options);
    if (lVar3 == 0) {
      if (*(int *)(puVar2 + 3) == 0) {
        bVar4 = fail == 0;
        if (bVar4) {
          fprintf(_stderr,"Failed to parse \'%s\' %lu\n",filename,limit);
        }
      }
      else {
        bVar4 = fail != 0;
        if (bVar4) {
          fprintf(_stderr,"Failed to get failure for \'%s\' %lu\n",filename,limit);
        }
      }
      ctxt._4_4_ = (uint)bVar4;
    }
    else {
      fprintf(_stderr,"SAX parsing generated a document !\n");
      xmlFreeDoc(lVar3);
      ctxt._4_4_ = 0;
    }
    *puVar2 = uVar1;
    xmlFreeParserCtxt(puVar2);
    filename_local._4_4_ = ctxt._4_4_;
  }
  return filename_local._4_4_;
}

Assistant:

static int
saxTest(const char *filename, size_t limit, int options, int fail) {
    int res = 0;
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    xmlSAXHandlerPtr old_sax;

    nb_tests++;

    maxlen = limit;
    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL) {
        fprintf(stderr, "Failed to create parser context\n");
	return(1);
    }
    old_sax = ctxt->sax;
    ctxt->sax = callbackSAX2Handler;
    ctxt->userData = NULL;
    doc = xmlCtxtReadFile(ctxt, filename, NULL, options);

    if (doc != NULL) {
        fprintf(stderr, "SAX parsing generated a document !\n");
        xmlFreeDoc(doc);
        res = 0;
    } else if (ctxt->wellFormed == 0) {
        if (fail)
            res = 0;
        else {
            fprintf(stderr, "Failed to parse '%s' %lu\n", filename,
                    (unsigned long) limit);
            res = 1;
        }
    } else {
        if (fail) {
            fprintf(stderr, "Failed to get failure for '%s' %lu\n",
                    filename, (unsigned long) limit);
            res = 1;
        } else
            res = 0;
    }
    ctxt->sax = old_sax;
    xmlFreeParserCtxt(ctxt);

    return(res);
}